

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O2

jint Java_beagle_BeagleJNIWrapper_calculateEdgeDerivative
               (JNIEnv *env,jobject obj,jint instance,jintArray postBufferIndices,
               jintArray preBufferIndices,jint rootBufferIndex,jintArray firstDerivativeIndices,
               jintArray secondDerivativeIndices,jint categoryWeightsIndex,jint categoryRatesIndex,
               jint stateFrequenciesIndex,jintArray cumulativeScaleIndices,jint count,
               jdoubleArray outFirstDerivative,jdoubleArray outDiagonalSecondDerivative)

{
  jint jVar1;
  jdouble *pjVar2;
  jdouble *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jint *pjVar6;
  jint *pjVar7;
  jint *pjVar8;
  
  pjVar3 = (jdouble *)0x0;
  pjVar2 = (*env->functions->GetDoubleArrayElements)(env,outFirstDerivative,(jboolean *)0x0);
  if (outDiagonalSecondDerivative != (jdoubleArray)0x0) {
    pjVar3 = (*env->functions->GetDoubleArrayElements)
                       (env,outDiagonalSecondDerivative,(jboolean *)0x0);
  }
  pjVar7 = (jint *)0x0;
  pjVar4 = (*env->functions->GetIntArrayElements)(env,postBufferIndices,(jboolean *)0x0);
  pjVar5 = (*env->functions->GetIntArrayElements)(env,preBufferIndices,(jboolean *)0x0);
  pjVar6 = (*env->functions->GetIntArrayElements)(env,firstDerivativeIndices,(jboolean *)0x0);
  if (secondDerivativeIndices != (jintArray)0x0) {
    pjVar7 = (*env->functions->GetIntArrayElements)(env,secondDerivativeIndices,(jboolean *)0x0);
  }
  pjVar8 = (*env->functions->GetIntArrayElements)(env,cumulativeScaleIndices,(jboolean *)0x0);
  jVar1 = beagleCalculateEdgeDerivative
                    (instance,pjVar4,pjVar5,rootBufferIndex,pjVar6,pjVar7,categoryWeightsIndex,
                     categoryRatesIndex,stateFrequenciesIndex,pjVar8,count,pjVar2,pjVar3);
  (*env->functions->ReleaseDoubleArrayElements)(env,outFirstDerivative,pjVar2,0);
  if (outDiagonalSecondDerivative != (jdoubleArray)0x0) {
    (*env->functions->ReleaseDoubleArrayElements)(env,outDiagonalSecondDerivative,pjVar3,0);
  }
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateEdgeDerivative
(JNIEnv *env, jobject obj, jint instance, jintArray postBufferIndices, jintArray preBufferIndices,
 jint rootBufferIndex, jintArray firstDerivativeIndices, jintArray secondDerivativeIndices,
 jint categoryWeightsIndex, jint categoryRatesIndex, jint stateFrequenciesIndex,
 jintArray cumulativeScaleIndices, jint count,
 jdoubleArray outFirstDerivative, jdoubleArray outDiagonalSecondDerivative)
{
    jdouble *outGradient = env->GetDoubleArrayElements(outFirstDerivative, NULL);
    jdouble *outDiagonalHessian = outDiagonalSecondDerivative != NULL ? env->GetDoubleArrayElements(outDiagonalSecondDerivative, NULL) : NULL;
    jint *postOrderBufferIndices = env->GetIntArrayElements(postBufferIndices, NULL);
    jint *preOrderBufferIndices  = env->GetIntArrayElements(preBufferIndices, NULL);
    jint *gradientMatrixIndices = env->GetIntArrayElements(firstDerivativeIndices, NULL);
    jint *hessianMatrixIndices  = secondDerivativeIndices != NULL ? env->GetIntArrayElements(secondDerivativeIndices, NULL) : NULL;
    jint *cumulativeScalingIndices = env->GetIntArrayElements(cumulativeScaleIndices, NULL);


    jint errCode = beagleCalculateEdgeDerivative(instance, (int*)postOrderBufferIndices, (int*)preOrderBufferIndices,
                                                 rootBufferIndex, (int*)gradientMatrixIndices, (int*)hessianMatrixIndices,
                                                 categoryWeightsIndex, categoryRatesIndex, stateFrequenciesIndex,
                                                 (int*)cumulativeScalingIndices, count, outGradient, outDiagonalHessian);
    env->ReleaseDoubleArrayElements(outFirstDerivative, outGradient, 0);
    if (outDiagonalSecondDerivative != NULL) {
        env->ReleaseDoubleArrayElements(outDiagonalSecondDerivative, outDiagonalHessian, 0);
    }
    return errCode;
}